

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O2

void __thiscall BMRS_XZ<UFPC>::PerformLabeling(BMRS_XZ<UFPC> *this)

{
  Data_Compressed *this_00;
  undefined8 uVar1;
  ushort uVar2;
  ushort uVar3;
  int _height;
  int iVar4;
  uint uVar5;
  Mat1b *pMVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  Mat1i *pMVar9;
  int iVar10;
  uint *puVar11;
  Run *pRVar12;
  ulong uVar13;
  Run *pRVar14;
  int k;
  ulong uVar15;
  long lVar16;
  int j_1;
  int iVar17;
  long lVar18;
  int j;
  ulong uVar19;
  int _height_00;
  long lVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  uint64_t *puVar24;
  long lVar25;
  int j_2;
  long lVar26;
  long lVar27;
  uint uVar28;
  uint64_t *puVar29;
  uint64_t *puVar30;
  long lVar31;
  Size local_98;
  Mat local_90 [96];
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  _height = *(int *)&pMVar6->field_0x8;
  iVar4 = *(int *)&pMVar6->field_0xc;
  lVar31 = (long)iVar4;
  this_00 = &this->data_compressed;
  Data_Compressed::Alloc(this_00,_height,iVar4);
  InitCompressedData(this,this_00);
  iVar10 = _height % 2;
  iVar17 = (int)((long)_height / 2);
  _height_00 = iVar17 + iVar10;
  uVar5 = (this->data_compressed).data_width;
  Data_Compressed::Alloc(&this->data_merged,_height_00,iVar4);
  puVar7 = (this->data_compressed).bits;
  puVar8 = (this->data_merged).bits;
  lVar21 = (long)(this->data_compressed).data_width;
  lVar18 = (long)(this->data_merged).data_width;
  uVar23 = 0;
  uVar13 = 0;
  if (0 < (int)uVar5) {
    uVar13 = (ulong)uVar5;
  }
  uVar15 = 0;
  if (0 < iVar17) {
    uVar15 = (long)_height / 2 & 0xffffffff;
  }
  puVar24 = puVar7 + lVar21;
  puVar29 = puVar8;
  puVar30 = puVar7;
  for (; uVar23 != uVar15; uVar23 = uVar23 + 1) {
    for (uVar19 = 0; uVar13 != uVar19; uVar19 = uVar19 + 1) {
      puVar29[uVar19] = puVar24[uVar19] | puVar30[uVar19];
    }
    puVar29 = puVar29 + lVar18;
    puVar24 = puVar24 + lVar21 * 2;
    puVar30 = puVar30 + lVar21 * 2;
  }
  if (iVar10 != 0) {
    for (uVar23 = 0; uVar13 != uVar23; uVar23 = uVar23 + 1) {
      puVar8[lVar18 * iVar17 + uVar23] = puVar7[lVar21 * (_height + -1) + uVar23];
    }
  }
  Data_Compressed::Alloc(&this->data_flags,_height_00 + -1,iVar4);
  uVar22 = (this->data_flags).height;
  puVar7 = (this->data_compressed).bits;
  puVar8 = (this->data_flags).bits;
  lVar18 = (long)(this->data_compressed).data_width;
  uVar23 = 0;
  uVar13 = (ulong)uVar22;
  if ((int)uVar22 < 1) {
    uVar13 = uVar23;
  }
  lVar21 = (long)(this->data_flags).data_width;
  puVar24 = puVar7 + lVar18;
  puVar30 = puVar8;
  puVar29 = puVar7;
  for (; puVar29 = puVar29 + lVar18 * 2, uVar23 != uVar13; uVar23 = uVar23 + 1) {
    puVar8[uVar23 * lVar21] =
         (puVar7[(uVar23 * 2 + 2) * lVar18] * 2 | puVar7[(uVar23 * 2 + 2) * lVar18]) &
         (puVar7[(uVar23 * 2 + 1) * lVar18] * 2 | puVar7[(uVar23 * 2 + 1) * lVar18]);
    for (lVar26 = 1; lVar26 < (int)uVar5; lVar26 = lVar26 + 1) {
      puVar30[lVar26] =
           (puVar29[lVar26 + -1] >> 0x3f | puVar29[lVar26] << 1 | puVar29[lVar26]) &
           (puVar24[lVar26 + -1] >> 0x3f | puVar24[lVar26] << 1 | puVar24[lVar26]);
    }
    puVar24 = puVar24 + lVar18 * 2;
    puVar30 = puVar30 + lVar21;
  }
  Runs::Alloc(&this->data_runs,_height_00,iVar4);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  FindRuns(this,(this->data_merged).bits,(this->data_flags).bits,_height_00,uVar5,
           (this->data_runs).runs);
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar1;
  local_98.width = (int)((ulong)uVar1 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pRVar14 = (this->data_runs).runs;
  pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  puVar7 = (this->data_compressed).bits;
  lVar18 = 1;
  lVar21 = 0;
  for (uVar13 = 0; puVar11 = UFPC::P_, uVar13 != uVar15; uVar13 = uVar13 + 1) {
    iVar4 = (this->data_compressed).data_width;
    iVar17 = (int)uVar13 * iVar4;
    lVar26 = **(long **)&pMVar9->field_0x48 * lVar21 + *(long *)&pMVar9->field_0x10;
    lVar27 = **(long **)&pMVar9->field_0x48 * lVar18 + *(long *)&pMVar9->field_0x10;
    lVar25 = 0;
    pRVar12 = pRVar14;
    do {
      pRVar14 = pRVar12;
      uVar2 = pRVar14->start_pos;
      if ((ulong)uVar2 == 0xffff) {
        lVar16 = (long)(int)lVar25;
        for (lVar20 = lVar16; lVar20 < lVar31; lVar20 = lVar20 + 1) {
          *(undefined4 *)(lVar26 + lVar20 * 4) = 0;
        }
        for (; lVar16 < lVar31; lVar16 = lVar16 + 1) {
          *(undefined4 *)(lVar27 + lVar16 * 4) = 0;
        }
        pRVar14 = pRVar14 + 1;
      }
      else {
        uVar3 = pRVar14->end_pos;
        uVar5 = puVar11[pRVar14->label];
        for (lVar25 = (long)(int)lVar25; lVar25 < (long)(ulong)uVar2; lVar25 = lVar25 + 1) {
          *(undefined4 *)(lVar26 + lVar25 * 4) = 0;
          *(undefined4 *)(lVar27 + lVar25 * 4) = 0;
        }
        for (; lVar25 < (long)(ulong)uVar3; lVar25 = lVar25 + 1) {
          lVar20 = (long)((int)(uint)lVar25 >> 6);
          uVar28 = (uint)lVar25 & 0x3f;
          uVar22 = uVar5;
          if ((puVar7[iVar17 * 2 + lVar20] >> uVar28 & 1) == 0) {
            uVar22 = 0;
          }
          *(uint *)(lVar26 + lVar25 * 4) = uVar22;
          uVar22 = uVar5;
          if ((puVar7[(long)(iVar17 * 2) + iVar4 + lVar20] >> uVar28 & 1) == 0) {
            uVar22 = 0;
          }
          *(uint *)(lVar27 + lVar25 * 4) = uVar22;
        }
      }
      pRVar12 = pRVar14 + 1;
    } while (uVar2 != 0xffff);
    lVar21 = lVar21 + 2;
    lVar18 = lVar18 + 2;
  }
  if (iVar10 != 0) {
    lVar18 = (long)(_height + -1) * **(long **)&pMVar9->field_0x48 + *(long *)&pMVar9->field_0x10;
    uVar13 = 0;
    do {
      uVar2 = pRVar14->start_pos;
      uVar23 = (ulong)uVar2;
      if (uVar23 == 0xffff) {
        for (lVar21 = (long)(int)uVar13; lVar21 < lVar31; lVar21 = lVar21 + 1) {
          *(undefined4 *)(lVar18 + lVar21 * 4) = 0;
        }
      }
      else {
        uVar3 = pRVar14->end_pos;
        uVar5 = puVar11[pRVar14->label];
        for (lVar21 = (long)(int)uVar13; lVar21 < (long)uVar23; lVar21 = lVar21 + 1) {
          *(undefined4 *)(lVar18 + lVar21 * 4) = 0;
        }
        for (; uVar13 = uVar23, uVar23 < uVar3; uVar23 = uVar23 + 1) {
          *(uint *)(lVar18 + uVar23 * 4) = uVar5;
        }
      }
      pRVar14 = pRVar14 + 1;
    } while (uVar2 != 0xffff);
  }
  UFPC::Dealloc();
  Runs::Dealloc(&this->data_runs);
  Data_Compressed::Dealloc(&this->data_flags);
  Data_Compressed::Dealloc(&this->data_merged);
  Data_Compressed::Dealloc(this_00);
  return;
}

Assistant:

void PerformLabeling()
    {
		int w(img_.cols);
		int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h_merge, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        img_labels_ = cv::Mat1i(img_.size());

        // New version (uses 1-byte per pixel input)
        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels_u[k] = 0;
                    for (int k = j; k < w; k++) labels_d[k] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (; j < start_pos; j++) labels_u[j] = 0, labels_d[j] = 0;
                for (; j < end_pos; j++) {
                    labels_u[j] = (data_u[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                    labels_d[j] = (data_d[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels[k] = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }